

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessHelper.cpp
# Opt level: O1

ai_real Assimp::ComputePositionEpsilon(aiMesh **pMeshes,size_t num)

{
  float fVar1;
  float fVar2;
  float fVar3;
  aiVector3D *paVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  size_t sVar9;
  ulong uVar10;
  long lVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  
  if (pMeshes != (aiMesh **)0x0) {
    if (num == 0) {
      fVar12 = -2e+10;
      fVar13 = 1e+10;
      fVar16 = 1e+10;
      fVar14 = -1e+10;
      fVar15 = -1e+10;
    }
    else {
      fVar5 = -1e+10;
      fVar6 = -1e+10;
      fVar7 = 1e+10;
      fVar8 = 1e+10;
      sVar9 = 0;
      fVar14 = fVar5;
      fVar15 = fVar6;
      fVar13 = fVar7;
      fVar16 = fVar8;
      fVar18 = 1e+10;
      fVar19 = -1e+10;
      do {
        uVar10 = (ulong)pMeshes[sVar9]->mNumVertices;
        fVar17 = 1e+10;
        fVar12 = -1e+10;
        fVar20 = fVar5;
        fVar21 = fVar6;
        fVar22 = fVar7;
        fVar23 = fVar8;
        if (uVar10 != 0) {
          paVar4 = pMeshes[sVar9]->mVertices;
          lVar11 = 0;
          fVar17 = 1e+10;
          fVar12 = -1e+10;
          do {
            fVar1 = *(float *)((long)&paVar4->x + lVar11);
            fVar2 = *(float *)((long)&paVar4->y + lVar11);
            if (fVar1 <= fVar22) {
              fVar22 = fVar1;
            }
            if (fVar2 <= fVar23) {
              fVar23 = fVar2;
            }
            fVar3 = *(float *)((long)&paVar4->z + lVar11);
            if (fVar3 <= fVar17) {
              fVar17 = fVar3;
            }
            if (fVar20 <= fVar1) {
              fVar20 = fVar1;
            }
            if (fVar21 <= fVar2) {
              fVar21 = fVar2;
            }
            if (fVar12 <= fVar3) {
              fVar12 = fVar3;
            }
            lVar11 = lVar11 + 0xc;
          } while (uVar10 * 0xc != lVar11);
        }
        if (fVar12 <= fVar19) {
          fVar12 = fVar19;
        }
        if (fVar18 <= fVar17) {
          fVar17 = fVar18;
        }
        if (fVar13 <= fVar22) {
          fVar22 = fVar13;
        }
        fVar13 = fVar22;
        if (fVar16 <= fVar23) {
          fVar23 = fVar16;
        }
        fVar16 = fVar23;
        if (fVar20 <= fVar14) {
          fVar20 = fVar14;
        }
        fVar14 = fVar20;
        if (fVar21 <= fVar15) {
          fVar21 = fVar15;
        }
        fVar15 = fVar21;
        sVar9 = sVar9 + 1;
        fVar18 = fVar17;
        fVar19 = fVar12;
      } while (sVar9 != num);
      fVar12 = fVar12 - fVar17;
    }
    fVar13 = fVar12 * fVar12 +
             (fVar14 - fVar13) * (fVar14 - fVar13) + (fVar15 - fVar16) * (fVar15 - fVar16);
    if (fVar13 < 0.0) {
      fVar13 = sqrtf(fVar13);
    }
    else {
      fVar13 = SQRT(fVar13);
    }
    return fVar13 * 0.0001;
  }
  __assert_fail("__null != pMeshes",
                "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/PostProcessing/ProcessHelper.cpp"
                ,0xa0,"ai_real Assimp::ComputePositionEpsilon(const aiMesh *const *, size_t)");
}

Assistant:

ai_real ComputePositionEpsilon(const aiMesh* const* pMeshes, size_t num)
{
    ai_assert( NULL != pMeshes );

    const ai_real epsilon = ai_real( 1e-4 );

    // calculate the position bounds so we have a reliable epsilon to check position differences against
    aiVector3D minVec, maxVec, mi, ma;
    MinMaxChooser<aiVector3D>()(minVec,maxVec);

    for (size_t a = 0; a < num; ++a) {
        const aiMesh* pMesh = pMeshes[a];
        ArrayBounds(pMesh->mVertices,pMesh->mNumVertices,mi,ma);

        minVec = std::min(minVec,mi);
        maxVec = std::max(maxVec,ma);
    }
    return (maxVec - minVec).Length() * epsilon;
}